

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O2

void __thiscall
lunasvg::SVGTextFragmentsBuilder::handleText(SVGTextFragmentsBuilder *this,SVGTextNode *node)

{
  ulong uVar1;
  _Bool _Var2;
  char32_t cVar3;
  SVGTextPositioningElement *pSVar4;
  char32_t __c;
  char32_t cVar5;
  size_type startOffset;
  SVGTextNode *node_local;
  ulong local_50;
  plutovg_text_iterator_t it;
  
  if ((node->m_data)._M_string_length != 0) {
    node_local = node;
    pSVar4 = toSVGTextPositioningElement(&((node->super_SVGNode).m_parentElement)->super_SVGNode);
    uVar1 = this->m_text->_M_string_length;
    cVar5 = L' ';
    if (uVar1 != 0) {
      cVar5 = (this->m_text->_M_dataplus)._M_p[uVar1 - 1];
    }
    startOffset = uVar1;
    plutovg_text_iterator_init
              (&it,(node->m_data)._M_dataplus._M_p,(int)(node->m_data)._M_string_length,
               PLUTOVG_TEXT_ENCODING_UTF8);
    while( true ) {
      _Var2 = plutovg_text_iterator_has_next(&it);
      if (!_Var2) break;
      cVar3 = plutovg_text_iterator_next(&it);
      __c = cVar3;
      if ((uint)(cVar3 + L'\xfffffff7') < 2) {
        __c = L' ';
      }
      if (cVar3 == L'\r') {
        __c = L' ';
      }
      if (((__c != L' ') || (cVar5 != L' ')) || (cVar5 = L' ', pSVar4->m_white_space != Default)) {
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back(this->m_text,__c);
        cVar5 = __c;
      }
    }
    local_50 = this->m_text->_M_string_length;
    if (uVar1 < local_50) {
      std::vector<lunasvg::SVGTextPosition,std::allocator<lunasvg::SVGTextPosition>>::
      emplace_back<lunasvg::SVGTextNode_const*&,unsigned_long_const&,unsigned_long>
                ((vector<lunasvg::SVGTextPosition,std::allocator<lunasvg::SVGTextPosition>> *)
                 &this->m_textPositions,&node_local,&startOffset,&local_50);
    }
  }
  return;
}

Assistant:

void SVGTextFragmentsBuilder::handleText(const SVGTextNode* node)
{
    const auto& text = node->data();
    if(text.empty())
        return;
    auto element = toSVGTextPositioningElement(node->parentElement());
    const auto startOffset = m_text.length();
    uint32_t lastCharacter = ' ';
    if(!m_text.empty()) {
        lastCharacter = m_text.back();
    }

    plutovg_text_iterator_t it;
    plutovg_text_iterator_init(&it, text.data(), text.length(), PLUTOVG_TEXT_ENCODING_UTF8);
    while(plutovg_text_iterator_has_next(&it)) {
        auto currentCharacter = plutovg_text_iterator_next(&it);
        if(currentCharacter == '\t' || currentCharacter == '\n' || currentCharacter == '\r')
            currentCharacter = ' ';
        if(currentCharacter == ' ' && lastCharacter == ' ' && element->white_space() == WhiteSpace::Default)
            continue;
        m_text.push_back(currentCharacter);
        lastCharacter = currentCharacter;
    }

    if(startOffset < m_text.length()) {
        m_textPositions.emplace_back(node, startOffset, m_text.length());
    }
}